

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall delta_complex_t::add_dimension(delta_complex_t *this)

{
  vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_> local_58 [2];
  vector<clique_t,_std::allocator<clique_t>_> local_28;
  delta_complex_t *local_10;
  delta_complex_t *this_local;
  
  local_28.super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_28.super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_10 = this;
  std::vector<clique_t,_std::allocator<clique_t>_>::vector(&local_28);
  std::
  vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
  ::push_back(&this->cliques,&local_28);
  std::vector<clique_t,_std::allocator<clique_t>_>::~vector(&local_28);
  local_58[0].super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58[0].super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58[0].super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::vector(local_58);
  std::
  vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
  ::push_back(&this->cells,local_58);
  std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::~vector(local_58);
  return;
}

Assistant:

void add_dimension(){
		//increase dimension of complex by adding new layer to cells and cliques
		cliques.push_back( std::vector<clique_t>() );
		cells.push_back( std::vector<delta_complex_cell_t>() );
	}